

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

void duckdb::ArgMaxNullFun::GetFunctions(void)

{
  vector<duckdb::LogicalType,_true> *__range2;
  AggregateFunctionSet *in_RDI;
  LogicalType *by_type;
  pointer by_type_00;
  vector<duckdb::LogicalType,_true> by_types;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  LogicalType local_30 [24];
  
  duckdb::AggregateFunctionSet::AggregateFunctionSet(in_RDI);
  duckdb::LogicalType::LogicalType((LogicalType *)&local_48,INTEGER);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>,int>
            (in_RDI,(LogicalType *)&local_48);
  duckdb::LogicalType::~LogicalType((LogicalType *)&local_48);
  duckdb::LogicalType::LogicalType((LogicalType *)&local_48,BIGINT);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>,long>
            (in_RDI,(LogicalType *)&local_48);
  duckdb::LogicalType::~LogicalType((LogicalType *)&local_48);
  duckdb::LogicalType::LogicalType((LogicalType *)&local_48,DOUBLE);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>,double>
            (in_RDI,(LogicalType *)&local_48);
  duckdb::LogicalType::~LogicalType((LogicalType *)&local_48);
  duckdb::LogicalType::LogicalType((LogicalType *)&local_48,VARCHAR);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>,duckdb::string_t>
            (in_RDI,(LogicalType *)&local_48);
  duckdb::LogicalType::~LogicalType((LogicalType *)&local_48);
  duckdb::LogicalType::LogicalType((LogicalType *)&local_48,DATE);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>,duckdb::date_t>
            (in_RDI,(LogicalType *)&local_48);
  duckdb::LogicalType::~LogicalType((LogicalType *)&local_48);
  duckdb::LogicalType::LogicalType((LogicalType *)&local_48,TIMESTAMP);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>,duckdb::timestamp_t>
            (in_RDI,(LogicalType *)&local_48);
  duckdb::LogicalType::~LogicalType((LogicalType *)&local_48);
  duckdb::LogicalType::LogicalType((LogicalType *)&local_48,TIMESTAMP_TZ);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>,duckdb::timestamp_t>
            (in_RDI,(LogicalType *)&local_48);
  duckdb::LogicalType::~LogicalType((LogicalType *)&local_48);
  duckdb::LogicalType::LogicalType((LogicalType *)&local_48,BLOB);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>,duckdb::string_t>
            (in_RDI,(LogicalType *)&local_48);
  duckdb::LogicalType::~LogicalType((LogicalType *)&local_48);
  ArgMaxByTypes();
  for (by_type_00 = local_48.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      by_type_00 !=
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_finish; by_type_00 = by_type_00 + 0x18) {
    AddDecimalArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
              (in_RDI,by_type_00);
  }
  duckdb::LogicalType::LogicalType(local_30,ANY);
  AddVectorArgMinMaxFunctionBy<duckdb::VectorArgMinMaxBase<duckdb::GreaterThan,false,(duckdb::OrderType)3,duckdb::SpecializedGenericArgMinMaxState>,duckdb::string_t>
            (in_RDI,local_30);
  duckdb::LogicalType::~LogicalType(local_30);
  AddGenericArgMinMaxFunction<duckdb::VectorArgMinMaxBase<duckdb::LessThan,false,(duckdb::OrderType)3,duckdb::GenericArgMinMaxState<(duckdb::OrderType)3>>>
            (in_RDI);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
  return;
}

Assistant:

AggregateFunctionSet ArgMaxNullFun::GetFunctions() {
	AggregateFunctionSet fun;
	AddArgMinMaxFunctions<GreaterThan, false, OrderType::DESCENDING>(fun);
	return fun;
}